

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

int amqp_ssl_socket_set_key_buffer(amqp_socket_t *base,char *cert,void *key,size_t n)

{
  int iVar1;
  BIO *bp;
  int in_ECX;
  void *in_RDX;
  char *in_RSI;
  long *in_RDI;
  amqp_ssl_socket_t *self;
  RSA *rsa;
  BIO *buf;
  int status;
  RSA *local_40;
  int local_2c;
  int local_4;
  
  local_40 = (RSA *)0x0;
  if ((amqp_socket_class_t *)*in_RDI == &amqp_ssl_socket_class) {
    iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)in_RDI[1],in_RSI);
    if (iVar1 == 1) {
      bp = BIO_new_mem_buf(in_RDX,in_ECX);
      if (((bp == (BIO *)0x0) ||
          (local_40 = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,password_cb,(void *)0x0),
          local_40 == (RSA *)0x0)) ||
         (iVar1 = SSL_CTX_use_RSAPrivateKey((SSL_CTX *)in_RDI[1],local_40), iVar1 != 1)) {
        local_2c = -0x200;
      }
      else {
        local_2c = 1;
      }
      BIO_vfree(bp);
      RSA_free(local_40);
      local_4 = local_2c;
    }
    else {
      local_4 = -0x200;
    }
    return local_4;
  }
  amqp_abort("<%p> is not of type amqp_ssl_socket_t",in_RDI);
}

Assistant:

int
amqp_ssl_socket_set_key_buffer(amqp_socket_t *base,
                               const char *cert,
                               const void *key,
                               size_t n)
{
  int status = AMQP_STATUS_OK;
  BIO *buf = NULL;
  RSA *rsa = NULL;
  struct amqp_ssl_socket_t *self;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  buf = BIO_new_mem_buf((void *)key, n);
  if (!buf) {
    goto error;
  }
  rsa = PEM_read_bio_RSAPrivateKey(buf, NULL, password_cb, NULL);
  if (!rsa) {
    goto error;
  }
  status = SSL_CTX_use_RSAPrivateKey(self->ctx, rsa);
  if (1 != status) {
    goto error;
  }
exit:
  BIO_vfree(buf);
  RSA_free(rsa);
  return status;
error:
  status = AMQP_STATUS_SSL_ERROR;
  goto exit;
}